

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::clara::TextFlow::Column::iterator::iterator(iterator *this,Column *column)

{
  bool bVar1;
  Column *column_local;
  iterator *this_local;
  
  this->m_column = column;
  this->m_stringIndex = 0;
  this->m_pos = 0;
  this->m_len = 0;
  this->m_end = 0;
  this->m_suffix = false;
  if (this->m_column->m_width <= this->m_column->m_indent) {
    __assert_fail("m_column.m_width > m_column.m_indent",
                  "/workspace/llm4binary/github/license_c_cmakelists/ricab[P]scope_guard/build_O0/_deps/catch2-src/single_include/catch2/catch.hpp"
                  ,0x2173,"Catch::clara::TextFlow::Column::iterator::iterator(const Column &)");
  }
  bVar1 = true;
  if (this->m_column->m_initialIndent != 0xffffffffffffffff) {
    bVar1 = this->m_column->m_initialIndent < this->m_column->m_width;
  }
  if (!bVar1) {
    __assert_fail("m_column.m_initialIndent == std::string::npos || m_column.m_width > m_column.m_initialIndent"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ricab[P]scope_guard/build_O0/_deps/catch2-src/single_include/catch2/catch.hpp"
                  ,0x2174,"Catch::clara::TextFlow::Column::iterator::iterator(const Column &)");
  }
  calcLength(this);
  if (this->m_len == 0) {
    this->m_stringIndex = this->m_stringIndex + 1;
  }
  return;
}

Assistant:

explicit iterator(Column const& column) : m_column(column) {
			assert(m_column.m_width > m_column.m_indent);
			assert(m_column.m_initialIndent == std::string::npos || m_column.m_width > m_column.m_initialIndent);
			calcLength();
			if (m_len == 0)
				m_stringIndex++; // Empty string
		}